

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O1

TX_SIZE av1_get_max_uv_txsize(BLOCK_SIZE bsize,int subsampling_x,int subsampling_y)

{
  byte bVar1;
  undefined3 in_register_00000039;
  
  bVar1 = ""[av1_ss_size_lookup[CONCAT31(in_register_00000039,bsize)][subsampling_x][subsampling_y]]
  ;
  if (bVar1 < 0x11) {
    if ((bVar1 - 0xb < 2) || (bVar1 == 4)) {
      return '\x03';
    }
  }
  else {
    if (bVar1 == 0x11) {
      return '\t';
    }
    if (bVar1 == 0x12) {
      return '\n';
    }
  }
  return bVar1;
}

Assistant:

static inline TX_SIZE av1_get_max_uv_txsize(BLOCK_SIZE bsize, int subsampling_x,
                                            int subsampling_y) {
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, subsampling_x, subsampling_y);
  assert(plane_bsize < BLOCK_SIZES_ALL);
  const TX_SIZE uv_tx = max_txsize_rect_lookup[plane_bsize];
  return av1_get_adjusted_tx_size(uv_tx);
}